

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<phmap::priv::BitMask<unsigned_int,16,0>,void>
               (BitMask<unsigned_int,_16,_0> *container,ostream *os)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  std::operator<<(os,'{');
  uVar2 = container->mask_;
  lVar3 = 0;
  do {
    if (uVar2 == 0) {
      if (lVar3 != 0) {
LAB_0013ceb9:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar3 != 0) && (std::operator<<(os,','), lVar3 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_0013ceb9;
    }
    iVar1 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
      }
    }
    std::operator<<(os,' ');
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    lVar3 = lVar3 + 1;
    uVar2 = uVar2 - 1 & uVar2;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }